

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,char *label,ImGuiID tab_id,
               ImGuiID close_button_id)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiID IVar3;
  ImGuiItemStatusFlags IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  int iVar7;
  ImU32 col;
  undefined7 extraout_var;
  char *pcVar8;
  undefined1 uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  char *label_end;
  float local_c8;
  float fStack_c4;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImDrawList *local_a0;
  ImVec2 local_98;
  ImVec2 IStack_90;
  float local_84;
  ImVec2 label_size;
  float local_78;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  local_98.x = (float)tab_id;
  local_a0 = draw_list;
  label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar12 = (bb->Min).x;
  local_c8 = (bb->Max).x;
  uVar9 = 0;
  if (1.0 < local_c8 - fVar12) {
    local_a8.y = (bb->Max).y;
    IVar1 = (pIVar5->Style).FramePadding;
    fVar11 = IVar1.x;
    fVar12 = fVar12 + fVar11;
    fVar13 = (bb->Min).y + IVar1.y;
    local_c8 = local_c8 - fVar11;
    local_b0.y = fVar13;
    local_b0.x = fVar12;
    local_48 = CONCAT44(fVar13,fVar12);
    uStack_40 = 0;
    local_78 = label_size.x;
    local_a8.x = local_c8;
    if ((flags & 1U) != 0) {
      IVar1 = CalcTextSize("*",(char *)0x0,false,-1.0);
      local_c8 = local_c8 - IVar1.x;
      IVar1 = (pIVar5->Style).FramePadding;
      fVar11 = IVar1.x;
      fVar13 = IVar1.y;
      fVar12 = (bb->Min).x + fVar11 + local_78 + 2.0;
      if (local_c8 <= fVar12) {
        fVar12 = local_c8;
      }
      label_end = (char *)CONCAT44(fVar13 + (bb->Min).y + (float)(int)(pIVar5->FontSize * -0.25),
                                   fVar12);
      local_60.y = (bb->Max).y - fVar13;
      local_60.x = (bb->Max).x - fVar11;
      local_38.x = 0.0;
      local_38.y = 0.0;
      local_a8.x = local_c8;
      RenderTextClippedEx(local_a0,(ImVec2 *)&label_end,&local_60,"*",(char *)0x0,(ImVec2 *)0x0,
                          &local_38,(ImRect *)0x0);
    }
    if ((close_button_id == 0) ||
       ((pIVar5->HoveredId != close_button_id && (float)pIVar5->HoveredId != local_98.x &&
        (pIVar5->ActiveId != close_button_id)))) {
      bVar6 = false;
      local_98.x = 0.0;
      local_98.y = 0.0;
    }
    else {
      pIVar2 = GImGui->CurrentWindow;
      local_84 = pIVar5->FontSize * 0.5;
      label_end = (char *)CONCAT44((bb->Min).y + (pIVar5->Style).FramePadding.y + local_84,
                                   ((bb->Max).x - (pIVar5->Style).FramePadding.x) - local_84);
      local_98 = (pIVar2->DC).LastItemRect.Min;
      IStack_90 = (pIVar2->DC).LastItemRect.Max;
      local_58 = (pIVar2->DC).LastItemDisplayRect.Min;
      IStack_50 = (pIVar2->DC).LastItemDisplayRect.Max;
      IVar3 = (pIVar2->DC).LastItemId;
      IVar4 = (pIVar2->DC).LastItemStatusFlags;
      bVar6 = CloseButton(close_button_id,(ImVec2 *)&label_end,local_84);
      uVar10 = CONCAT71(extraout_var,bVar6) & 0xffffffff;
      pIVar2 = GImGui->CurrentWindow;
      (pIVar2->DC).LastItemId = IVar3;
      (pIVar2->DC).LastItemStatusFlags = IVar4;
      (pIVar2->DC).LastItemRect.Min = local_98;
      (pIVar2->DC).LastItemRect.Max = IStack_90;
      (pIVar2->DC).LastItemDisplayRect.Min = local_58;
      (pIVar2->DC).LastItemDisplayRect.Max = IStack_50;
      if ((flags & 4U) == 0) {
        bVar6 = IsMouseClicked(2,false);
        uVar10 = CONCAT71((int7)(uVar10 >> 8),(byte)uVar10 | bVar6);
      }
      local_a8.x = local_c8 - (local_84 + local_84);
      bVar6 = true;
      local_98 = (ImVec2)uVar10;
    }
    pcVar8 = FindRenderedTextEnd(label,(char *)0x0);
    if (local_78 <= local_c8 - (float)local_48) {
      label_end = (char *)0x0;
      RenderTextClippedEx(local_a0,&local_b0,&local_a8,label,pcVar8,&label_size,(ImVec2 *)&label_end
                          ,(ImRect *)0x0);
    }
    else {
      label_end = (char *)0x0;
      IVar1 = ImFont::CalcTextSizeA
                        (pIVar5->Font,pIVar5->FontSize,(local_c8 - (float)local_48) + -5.0 + 1.0,0.0
                         ,label,pcVar8,&label_end);
      fVar12 = IVar1.x;
      fStack_c4 = IVar1.y;
      if (label_end < pcVar8 && label_end == label) {
        iVar7 = ImTextCountUtf8BytesFromChar(label,pcVar8);
        label_end = label + iVar7;
        IVar1 = ImFont::CalcTextSizeA
                          (pIVar5->Font,pIVar5->FontSize,3.4028235e+38,0.0,label,label_end,
                           (char **)0x0);
        fVar12 = IVar1.x;
        fStack_c4 = IVar1.y;
      }
      local_c8 = fVar12;
      pcVar8 = label_end;
      while ((label < pcVar8 && ((pcVar8[-1] == ' ' || (pcVar8[-1] == '\t'))))) {
        label_end = pcVar8 + -1;
        IVar1 = ImFont::CalcTextSizeA
                          (pIVar5->Font,pIVar5->FontSize,3.4028235e+38,0.0,label_end,pcVar8,
                           (char **)0x0);
        local_c8 = local_c8 - IVar1.x;
        pcVar8 = label_end;
      }
      local_60.x = 0.0;
      local_60.y = 0.0;
      label_end = pcVar8;
      RenderTextClippedEx(local_a0,&local_b0,&local_a8,label,pcVar8,&label_size,&local_60,
                          (ImRect *)0x0);
      if (!bVar6) {
        local_c8 = local_c8 + local_b0.x + 1.0;
        if (local_c8 + 5.0 <= (bb->Max).x) {
          fVar12 = local_b0.y;
          col = GetColorU32(0,1.0);
          IVar1.y = fVar12;
          IVar1.x = local_c8;
          RenderPixelEllipsis(local_a0,IVar1,3,col);
        }
      }
    }
    uVar9 = local_98.x._0_1_;
  }
  return (bool)uVar9;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, const char* label, ImGuiID tab_id, ImGuiID close_button_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + style.FramePadding.x, bb.Min.y + style.FramePadding.y, bb.Max.x - style.FramePadding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + style.FramePadding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + style.FramePadding.y + (float)(int)(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - style.FramePadding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
            close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize * 0.5f;
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - style.FramePadding.x - close_button_sz, bb.Min.y + style.FramePadding.y + close_button_sz), close_button_sz))
            close_button_pressed = true;
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz * 2.0f;
    }

    // Label with ellipsis
    // FIXME: This should be extracted into a helper but the use of text_pixel_clip_bb and !close_button_visible makes it tricky to abstract at the moment
    const char* label_display_end = FindRenderedTextEnd(label);
    if (label_size.x > text_ellipsis_clip_bb.GetWidth())
    {
        const int ellipsis_dot_count = 3;
        const float ellipsis_width = (1.0f + 1.0f) * ellipsis_dot_count - 1.0f;
        const char* label_end = NULL;
        float label_size_clipped_x = g.Font->CalcTextSizeA(g.FontSize, text_ellipsis_clip_bb.GetWidth() - ellipsis_width + 1.0f, 0.0f, label, label_display_end, &label_end).x;
        if (label_end == label && label_end < label_display_end)    // Always display at least 1 character if there's no room for character + ellipsis
        {
            label_end = label + ImTextCountUtf8BytesFromChar(label, label_display_end);
            label_size_clipped_x = g.Font->CalcTextSizeA(g.FontSize, FLT_MAX, 0.0f, label, label_end).x;
        }
        while (label_end > label && ImCharIsBlankA(label_end[-1])) // Trim trailing space
        {
            label_end--;
            label_size_clipped_x -= g.Font->CalcTextSizeA(g.FontSize, FLT_MAX, 0.0f, label_end, label_end + 1).x; // Ascii blanks are always 1 byte
        }
        RenderTextClippedEx(draw_list, text_pixel_clip_bb.Min, text_pixel_clip_bb.Max, label, label_end, &label_size, ImVec2(0.0f, 0.0f));

        const float ellipsis_x = text_pixel_clip_bb.Min.x + label_size_clipped_x + 1.0f;
        if (!close_button_visible && ellipsis_x + ellipsis_width <= bb.Max.x)
            RenderPixelEllipsis(draw_list, ImVec2(ellipsis_x, text_pixel_clip_bb.Min.y), ellipsis_dot_count, GetColorU32(ImGuiCol_Text));
    }
    else
    {
        RenderTextClippedEx(draw_list, text_pixel_clip_bb.Min, text_pixel_clip_bb.Max, label, label_display_end, &label_size, ImVec2(0.0f, 0.0f));
    }

    return close_button_pressed;
}